

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86SUBSD(uchar *stream,x86XmmReg dst,x86XmmReg src)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  x86XmmReg src_local;
  x86XmmReg dst_local;
  uchar *stream_local;
  
  *stream = 0xf2;
  uVar2 = encodeRex(stream + 1,false,dst,src);
  puVar3 = stream + 1 + uVar2;
  *puVar3 = '\x0f';
  puVar3[1] = '\\';
  uVar1 = encodeRegister(src,dst);
  puVar3[2] = uVar1;
  return ((int)puVar3 + 3) - (int)stream;
}

Assistant:

int x86SUBSD(unsigned char *stream, x86XmmReg dst, x86XmmReg src)
{
	unsigned char *start = stream;

	*stream++ = 0xf2;
	stream += encodeRex(stream, false, dst, src);
	*stream++ = 0x0f;
	*stream++ = 0x5c;
	*stream++ = encodeRegister(src, dst);

	return int(stream - start);
}